

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.cpp
# Opt level: O2

void __thiscall llbuild::buildsystem::BuildValue::dump(BuildValue *this,raw_ostream *os)

{
  bool bVar1;
  Kind KVar2;
  uint uVar3;
  raw_ostream *prVar4;
  FileInfo *this_00;
  uint i;
  uint uVar5;
  char *Str;
  ulong uVar6;
  StringRef SVar7;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> values;
  
  prVar4 = llvm::raw_ostream::operator<<(os,"BuildValue(");
  SVar7 = stringForKind(this->kind);
  llvm::raw_ostream::operator<<(prVar4,SVar7);
  KVar2 = this->kind;
  if ((KVar2 < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20060U >> (KVar2 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    prVar4 = llvm::raw_ostream::operator<<(os,", signature=");
    llvm::raw_ostream::operator<<(prVar4,(this->signature).value);
    KVar2 = this->kind;
  }
  if ((KVar2 < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20414U >> (KVar2 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    llvm::raw_ostream::operator<<(os,", outputInfos=[");
    uVar5 = 0;
    while( true ) {
      uVar3 = getNumOutputs(this);
      if (uVar5 == uVar3) break;
      this_00 = getNthOutputInfo(this,uVar5);
      if (uVar5 != 0) {
        llvm::raw_ostream::operator<<(os,", ");
      }
      bVar1 = llbuild::basic::FileInfo::isMissing(this_00);
      if (bVar1) {
        Str = "FileInfo{/*missing*/}";
        prVar4 = os;
      }
      else {
        prVar4 = llvm::raw_ostream::operator<<(os,"FileInfo{");
        prVar4 = llvm::raw_ostream::operator<<(prVar4,"dev=");
        prVar4 = llvm::raw_ostream::operator<<(prVar4,this_00->device);
        prVar4 = llvm::raw_ostream::operator<<(prVar4,", inode=");
        prVar4 = llvm::raw_ostream::operator<<(prVar4,this_00->inode);
        prVar4 = llvm::raw_ostream::operator<<(prVar4,", mode=");
        prVar4 = llvm::raw_ostream::operator<<(prVar4,this_00->mode);
        prVar4 = llvm::raw_ostream::operator<<(prVar4,", size=");
        prVar4 = llvm::raw_ostream::operator<<(prVar4,this_00->size);
        prVar4 = llvm::raw_ostream::operator<<(prVar4,", modTime=(");
        prVar4 = llvm::raw_ostream::operator<<(prVar4,(this_00->modTime).seconds);
        prVar4 = llvm::raw_ostream::operator<<(prVar4,":");
        prVar4 = llvm::raw_ostream::operator<<(prVar4,(this_00->modTime).nanoseconds);
        Str = "}";
      }
      llvm::raw_ostream::operator<<(prVar4,Str);
      uVar5 = uVar5 + 1;
    }
    llvm::raw_ostream::operator<<(os,"]");
    KVar2 = this->kind;
  }
  if ((KVar2 < SuccessfulCommandWithOutputSignature) &&
     ((0x10090U >> (KVar2 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    getStringListValues(&values,this);
    llvm::raw_ostream::operator<<(os,", values=[");
    for (uVar5 = 0; uVar6 = (ulong)uVar5,
        (long)values.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)values.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 != uVar6; uVar5 = uVar5 + 1) {
      if (uVar6 != 0) {
        llvm::raw_ostream::operator<<(os,", ");
      }
      llvm::raw_ostream::operator<<(os,'\"');
      SVar7.Length = values.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6].Length;
      SVar7.Data = values.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar6].Data;
      llvm::raw_ostream::write_escaped(os,SVar7,false);
      llvm::raw_ostream::operator<<(os,'\"');
    }
    llvm::raw_ostream::operator<<(os,"]");
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
              (&values.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>);
  }
  llvm::raw_ostream::operator<<(os,")");
  return;
}

Assistant:

void BuildValue::dump(raw_ostream& os) const {
  os << "BuildValue(" << stringForKind(kind);
  if (kindHasSignature()) {
    os << ", signature=" << signature.value;
  }
  if (kindHasOutputInfo()) {
    os << ", outputInfos=[";
    for (unsigned i = 0; i != getNumOutputs(); ++i) {
      auto& info = getNthOutputInfo(i);
      if (i != 0) os << ", ";
      if (info.isMissing()) {
        os << "FileInfo{/*missing*/}";
      } else {
        os << "FileInfo{"
           << "dev=" << info.device
           << ", inode=" << info.inode
           << ", mode=" << info.mode
           << ", size=" << info.size
           << ", modTime=(" << info.modTime.seconds
           << ":" << info.modTime.nanoseconds << "}";
      }
    }
    os << "]";
  }
  if (kindHasStringList()) {
    std::vector<StringRef> values = getStringListValues();
    os << ", values=[";
    for (unsigned i = 0; i != values.size(); ++i) {
      if (i != 0) os << ", ";
      os << '"';
      os.write_escaped(values[i]);
      os << '"';
    }
    os << "]";
  }
  os << ")";
}